

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_field.cc
# Opt level: O1

FieldGenerator *
google::protobuf::compiler::javanano::FieldGeneratorMap::MakeGenerator
          (FieldDescriptor *field,Params *params,int *next_has_bit_index)

{
  int iVar1;
  Type field_type;
  JavaType JVar2;
  Descriptor *pDVar3;
  AccessorEnumFieldGenerator *this;
  
  field_type = FieldDescriptor::type(field);
  JVar2 = GetJavaType(field_type);
  if (*(int *)(field + 0x4c) == 3) {
    if (JVar2 == JAVATYPE_ENUM) {
      this = (AccessorEnumFieldGenerator *)operator_new(0x60);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)this,field,params);
    }
    else if (JVar2 == JAVATYPE_MESSAGE) {
      pDVar3 = FieldDescriptor::message_type(field);
      if ((*(char *)(*(long *)(pDVar3 + 0x20) + 0x6b) == '\x01') &&
         (*(int *)(*(long *)(pDVar3 + 0x10) + 0x8c) == 3)) {
        this = (AccessorEnumFieldGenerator *)operator_new(0x48);
        MapFieldGenerator::MapFieldGenerator((MapFieldGenerator *)this,field,params);
      }
      else {
        this = (AccessorEnumFieldGenerator *)operator_new(0x48);
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  ((RepeatedMessageFieldGenerator *)this,field,params);
      }
    }
    else {
      this = (AccessorEnumFieldGenerator *)operator_new(0x48);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)this,field,params);
    }
  }
  else if (*(long *)(field + 0x60) == 0) {
    if ((params->optional_field_accessors_ == true) &&
       (JVar2 != JAVATYPE_MESSAGE && *(int *)(field + 0x4c) == 1)) {
      if (JVar2 == JAVATYPE_ENUM) {
        this = (AccessorEnumFieldGenerator *)operator_new(0x60);
        iVar1 = *next_has_bit_index;
        *next_has_bit_index = iVar1 + 1;
        AccessorEnumFieldGenerator::AccessorEnumFieldGenerator(this,field,params,iVar1);
      }
      else {
        this = (AccessorEnumFieldGenerator *)operator_new(0x48);
        iVar1 = *next_has_bit_index;
        *next_has_bit_index = iVar1 + 1;
        AccessorPrimitiveFieldGenerator::AccessorPrimitiveFieldGenerator
                  ((AccessorPrimitiveFieldGenerator *)this,field,params,iVar1);
      }
    }
    else if (JVar2 == JAVATYPE_ENUM) {
      this = (AccessorEnumFieldGenerator *)operator_new(0x60);
      EnumFieldGenerator::EnumFieldGenerator((EnumFieldGenerator *)this,field,params);
    }
    else if (JVar2 == JAVATYPE_MESSAGE) {
      this = (AccessorEnumFieldGenerator *)operator_new(0x48);
      MessageFieldGenerator::MessageFieldGenerator((MessageFieldGenerator *)this,field,params);
    }
    else {
      this = (AccessorEnumFieldGenerator *)operator_new(0x48);
      PrimitiveFieldGenerator::PrimitiveFieldGenerator((PrimitiveFieldGenerator *)this,field,params)
      ;
    }
  }
  else {
    this = (AccessorEnumFieldGenerator *)operator_new(0x48);
    if (JVar2 == JAVATYPE_MESSAGE) {
      MessageOneofFieldGenerator::MessageOneofFieldGenerator
                ((MessageOneofFieldGenerator *)this,field,params);
    }
    else {
      PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator
                ((PrimitiveOneofFieldGenerator *)this,field,params);
    }
  }
  return &this->super_FieldGenerator;
}

Assistant:

FieldGenerator* FieldGeneratorMap::MakeGenerator(const FieldDescriptor* field,
    const Params &params, int* next_has_bit_index) {
  JavaType java_type = GetJavaType(field);
  if (field->is_repeated()) {
    switch (java_type) {
      case JAVATYPE_MESSAGE:
        if (IsMapEntry(field->message_type())) {
          return new MapFieldGenerator(field, params);
        } else {
          return new RepeatedMessageFieldGenerator(field, params);
        }
      case JAVATYPE_ENUM:
        return new RepeatedEnumFieldGenerator(field, params);
      default:
        return new RepeatedPrimitiveFieldGenerator(field, params);
    }
  } else if (field->containing_oneof()) {
    switch (java_type) {
      case JAVATYPE_MESSAGE:
        return new MessageOneofFieldGenerator(field, params);
      case JAVATYPE_ENUM:
      default:
        return new PrimitiveOneofFieldGenerator(field, params);
    }
  } else if (params.optional_field_accessors() && field->is_optional()
      && java_type != JAVATYPE_MESSAGE) {
    // We need a has-bit for each primitive/enum field because their default
    // values could be same as explicitly set values. But we don't need it
    // for a message field because they have no defaults and Nano uses 'null'
    // for unset messages, which cannot be set explicitly.
    switch (java_type) {
      case JAVATYPE_ENUM:
        return new AccessorEnumFieldGenerator(
            field, params, (*next_has_bit_index)++);
      default:
        return new AccessorPrimitiveFieldGenerator(
            field, params, (*next_has_bit_index)++);
    }
  } else {
    switch (java_type) {
      case JAVATYPE_MESSAGE:
        return new MessageFieldGenerator(field, params);
      case JAVATYPE_ENUM:
        return new EnumFieldGenerator(field, params);
      default:
        return new PrimitiveFieldGenerator(field, params);
    }
  }
}